

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::ClientImpl::ClientImpl
          (ClientImpl *this,string *host,int port,string *client_cert_path,string *client_key_path)

{
  _Rb_tree_header *p_Var1;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_ClientImpl = (_func_int **)&PTR__ClientImpl_0016c150;
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  this->port_ = port;
  adjust_host_string(&local_70,this,host);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,port);
  std::operator+(&this->host_and_port_,&local_50,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (this->socket_).sock = -1;
  *(undefined8 *)((long)&(this->request_mutex_).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->request_mutex_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->socket_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->socket_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->socket_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->socket_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->socket_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header;
  this->socket_requests_in_flight_ = 0;
  (this->socket_requests_are_from_thread_)._M_thread = 0;
  this->socket_should_be_closed_when_request_is_done_ = false;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->client_cert_path_,(string *)client_cert_path);
  std::__cxx11::string::string((string *)&this->client_key_path_,(string *)client_key_path);
  this->connection_timeout_sec_ = 300;
  this->connection_timeout_usec_ = 0;
  this->read_timeout_sec_ = 5;
  this->read_timeout_usec_ = 0;
  this->write_timeout_sec_ = 5;
  this->write_timeout_usec_ = 0;
  (this->basic_auth_username_)._M_dataplus._M_p = (pointer)&(this->basic_auth_username_).field_2;
  (this->basic_auth_username_)._M_string_length = 0;
  (this->basic_auth_username_).field_2._M_local_buf[0] = '\0';
  (this->basic_auth_password_)._M_dataplus._M_p = (pointer)&(this->basic_auth_password_).field_2;
  (this->basic_auth_password_)._M_string_length = 0;
  (this->basic_auth_password_).field_2._M_local_buf[0] = '\0';
  (this->bearer_token_auth_token_)._M_dataplus._M_p =
       (pointer)&(this->bearer_token_auth_token_).field_2;
  (this->bearer_token_auth_token_)._M_string_length = 0;
  (this->bearer_token_auth_token_).field_2._M_local_buf[0] = '\0';
  this->keep_alive_ = false;
  this->follow_location_ = false;
  this->url_encode_ = true;
  this->address_family_ = 0;
  this->tcp_nodelay_ = false;
  (this->socket_options_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->socket_options_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->socket_options_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->socket_options_).super__Function_base._M_functor + 8) = 0;
  this->compress_ = false;
  this->decompress_ = true;
  (this->interface_)._M_dataplus._M_p = (pointer)&(this->interface_).field_2;
  (this->interface_)._M_string_length = 0;
  (this->interface_).field_2._M_local_buf[0] = '\0';
  (this->proxy_host_)._M_dataplus._M_p = (pointer)&(this->proxy_host_).field_2;
  (this->proxy_host_)._M_string_length = 0;
  (this->proxy_host_).field_2._M_local_buf[0] = '\0';
  this->proxy_port_ = -1;
  (this->proxy_basic_auth_username_)._M_dataplus._M_p =
       (pointer)&(this->proxy_basic_auth_username_).field_2;
  (this->proxy_basic_auth_username_)._M_string_length = 0;
  (this->proxy_basic_auth_username_).field_2._M_local_buf[0] = '\0';
  (this->proxy_basic_auth_password_)._M_dataplus._M_p =
       (pointer)&(this->proxy_basic_auth_password_).field_2;
  (this->proxy_basic_auth_password_)._M_string_length = 0;
  (this->proxy_basic_auth_password_).field_2._M_local_buf[0] = '\0';
  (this->proxy_bearer_token_auth_token_)._M_dataplus._M_p =
       (pointer)&(this->proxy_bearer_token_auth_token_).field_2;
  (this->proxy_bearer_token_auth_token_)._M_string_length = 0;
  (this->proxy_bearer_token_auth_token_).field_2._M_local_buf[0] = '\0';
  (this->logger_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logger_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logger_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logger_).super__Function_base._M_functor + 8) = 0;
  return;
}

Assistant:

inline ClientImpl::ClientImpl(const std::string &host, int port,
                              const std::string &client_cert_path,
                              const std::string &client_key_path)
    : host_(host), port_(port),
      host_and_port_(adjust_host_string(host) + ":" + std::to_string(port)),
      client_cert_path_(client_cert_path), client_key_path_(client_key_path) {}